

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>::val
          (FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_> *this)

{
  Fad<double> *in_RSI;
  value_type *in_RDI;
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *in_stack_ffffffffffffffe8;
  Fad<double> *this_00;
  value_type *e;
  
  this_00 = in_RSI;
  e = in_RDI;
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)in_RSI->val_);
  FadCst<double>::val((FadCst<double> *)&in_RSI->dx_);
  operator/<Fad<double>,_double,_nullptr>(e,(double)this_00);
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,FadCst<double>>>(this_00,in_stack_ffffffffffffffe8);
  FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_> *)in_RDI);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}